

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlDebugDumpAttr(FILE *output,xmlAttrPtr attr,int depth)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_a0;
  
  if (output != (FILE *)0x0) {
    local_a0.nodict = 0;
    local_a0.options = 0;
    local_a0.doc = (xmlDocPtr)0x0;
    local_a0.node = (xmlNodePtr)0x0;
    local_a0.dict = (xmlDictPtr)0x0;
    local_a0.check = 0;
    local_a0.errors = 0;
    builtin_strncpy(local_a0.shift,
                    "                                                                                                    "
                    ,0x65);
    local_a0.output = output;
    local_a0.depth = depth;
    xmlCtxtDumpAttr(&local_a0,attr);
  }
  return;
}

Assistant:

void
xmlDebugDumpAttr(FILE *output, xmlAttrPtr attr, int depth) {
    xmlDebugCtxt ctxt;

    if (output == NULL) return;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.depth = depth;
    xmlCtxtDumpAttr(&ctxt, attr);
    xmlCtxtDumpCleanCtxt(&ctxt);
}